

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_common.c
# Opt level: O0

void bitrev_init(int n,int *rho)

{
  uint uVar1;
  int one;
  int lastbit;
  int k;
  int val;
  int rem;
  int n1;
  int j;
  int *rho_local;
  int n_local;
  
  if (n == 1) {
    *rho = 0;
  }
  else {
    for (j = 0; j < n; j = j + 1) {
      rem = j;
      val = 0;
      for (k = 1; k < n; k = k << 1) {
        uVar1 = rem & 1;
        rem = rem >> 1;
        val = uVar1 | val << 1;
      }
      rho[j] = val;
    }
  }
  return;
}

Assistant:

void bitrev_init(int n, int *rho)
    {
    int j;
    int n1, rem, val, k, lastbit, one=1;

    if (n==1)
        {
        rho[0]= 0;
        return;
        }
    n1= n;
    for(j=0; j<n; j++)
        {
        rem= j; 
        val= 0;
        for (k=1; k<n1; k <<= 1)
            {
            lastbit= rem & one;
            rem >>= 1;
            val <<= 1;
            val |= lastbit;
            }
        rho[j]= (int)val;
        }
   }